

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeSetFixedStep(void *arkode_mem,sunrealtype hfixed)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x4d9;
LAB_0013607d:
    arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetFixedStep",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,msgfmt);
  }
  else {
    if ((hfixed == 0.0) && (!NAN(hfixed))) {
      if (*(int *)((long)arkode_mem + 0xf0) == 0) {
        msgfmt = "temporal adaptivity is not supported by this time step module";
        iVar2 = -0x30;
        error_code = -0x30;
        iVar1 = 0x4e2;
        goto LAB_0013607d;
      }
      if (*(int *)((long)arkode_mem + 0x54) == 0) {
        if ((*(int *)((long)arkode_mem + 0x18) == 1) &&
           (*(N_Vector *)((long)arkode_mem + 0x30) != (N_Vector)0x0)) {
          iVar1 = ARKodeSVtolerances(arkode_mem,*(sunrealtype *)((long)arkode_mem + 0x20),
                                     *(N_Vector *)((long)arkode_mem + 0x30));
        }
        else {
          iVar1 = ARKodeSStolerances(arkode_mem,*(sunrealtype *)((long)arkode_mem + 0x20),
                                     *(sunrealtype *)((long)arkode_mem + 0x28));
        }
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    }
    if ((hfixed != 0.0) || (NAN(hfixed))) {
      *(undefined4 *)((long)arkode_mem + 0x2e0) = 1;
      *(sunrealtype *)((long)arkode_mem + 0x298) = hfixed;
    }
    else {
      *(undefined4 *)((long)arkode_mem + 0x2e0) = 0;
    }
    ARKodeSetInitStep(arkode_mem,hfixed);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ARKodeSetFixedStep(void* arkode_mem, sunrealtype hfixed)
{
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* ensure that when hfixed=0, the time step module supports adaptivity */
  if ((hfixed == ZERO) && (!ark_mem->step_supports_adaptive))
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "temporal adaptivity is not supported by this time step module");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* re-attach internal error weight functions if necessary */
  if ((hfixed == ZERO) && (!ark_mem->user_efun))
  {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
    {
      retval = ARKodeSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    }
    else
    {
      retval = ARKodeSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    }
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* set ark_mem "fixedstep" entry */
  if (hfixed != ZERO)
  {
    ark_mem->fixedstep = SUNTRUE;
    ark_mem->hin       = hfixed;
  }
  else { ark_mem->fixedstep = SUNFALSE; }

  /* Notify ARKODE to use hfixed as the initial step size, and return */
  retval = ARKodeSetInitStep(arkode_mem, hfixed);

  return (ARK_SUCCESS);
}